

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NtkAddBuffsEval2(Abc_Obj_t *pNode,Abc_Obj_t *pFanin)

{
  Abc_Obj_t *pAVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(pFanin->vFanouts).nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pFanin->pNtk->vObjs->pArray[(pFanin->vFanouts).pArray[lVar3]];
      if ((pAVar1 != pNode) &&
         (*(uint *)&pNode->field_0x14 >> 0xc < *(uint *)&pAVar1->field_0x14 >> 0xc)) {
        return 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return 0;
}

Assistant:

int Abc_NtkAddBuffsEval2( Abc_Obj_t * pNode, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pFanin, pFanout, i )
        if ( pFanout != pNode && pFanout->Level > pNode->Level )
            return 1;
    return 0;
}